

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::RemoveBlockRequest
          (PeerManagerImpl *this,uint256 *hash,optional<long> from_peer)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  CNodeState *pCVar6;
  iterator iVar7;
  time_point tVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var11;
  long lVar12;
  _Self __tmp;
  char *in_R8;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var13;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar14;
  CNodeState *local_40;
  long local_38;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var10;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pVar14 = std::
           multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
           ::equal_range(&this->mapBlocksInFlight,hash);
  _Var10 = pVar14.second._M_node;
  if (pVar14.first._M_node._M_node != _Var10._M_node) {
    p_Var2 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    do {
      iVar7._M_node = (_Base_ptr)pVar14.first._M_node;
      lVar3 = *(long *)(iVar7._M_node + 2);
      p_Var4 = iVar7._M_node[2]._M_parent;
      if ((((undefined1  [16])
            from_peer.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         (lVar3 == from_peer.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload)) {
        p_Var5 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 = &p_Var2->_M_header;
        for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
            p_Var5 = (&p_Var5->_M_left)[(long)*(size_t *)(p_Var5 + 1) < lVar3]) {
          if (lVar3 <= (long)*(size_t *)(p_Var5 + 1)) {
            p_Var9 = p_Var5;
          }
        }
        p_Var11 = p_Var2;
        if (((_Rb_tree_header *)p_Var9 != p_Var2) &&
           (p_Var11 = (_Rb_tree_header *)p_Var9,
           lVar3 < (long)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
          p_Var11 = p_Var2;
        }
        local_40 = (CNodeState *)(p_Var11 + 1);
        if (p_Var11 == p_Var2) {
          local_40 = (CNodeState *)0x0;
        }
        inline_assertion_check<true,(anonymous_namespace)::CNodeState*>
                  (&local_40,(char *)0x533,0x811c50,"State(node_id)",in_R8);
        pCVar6 = local_40;
        if ((_Base_ptr)
            (local_40->vBlocksInFlight).
            super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
            ._M_impl._M_node.super__List_node_base._M_next == p_Var4) {
          tVar8 = NodeClock::now();
          lVar3 = (pCVar6->m_downloading_since).__r;
          lVar12 = (long)tVar8.__d.__r / 1000;
          if ((long)tVar8.__d.__r / 1000 < lVar3) {
            lVar12 = lVar3;
          }
          (pCVar6->m_downloading_since).__r = lVar12;
        }
        psVar1 = &(pCVar6->vBlocksInFlight).
                  super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        if ((PartiallyDownloadedBlock *)p_Var4->_M_right != (PartiallyDownloadedBlock *)0x0) {
          std::default_delete<PartiallyDownloadedBlock>::operator()
                    ((default_delete<PartiallyDownloadedBlock> *)&p_Var4->_M_right,
                     (PartiallyDownloadedBlock *)p_Var4->_M_right);
        }
        p_Var4->_M_right = (_Base_ptr)0x0;
        operator_delete(p_Var4,0x20);
        if ((pCVar6->vBlocksInFlight).
            super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
            ._M_impl._M_node.super__List_node_base._M_next ==
            (_List_node_base *)&pCVar6->vBlocksInFlight) {
          this->m_peers_downloading_from = this->m_peers_downloading_from + -1;
        }
        (pCVar6->m_stalling_since).__r = 0;
        iVar7 = std::
                multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                ::erase_abi_cxx11_((multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                                    *)&this->mapBlocksInFlight,iVar7);
        _Var13._M_node = _Var10._M_node;
      }
      else {
        iVar7._M_node = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)iVar7._M_node);
        _Var13._M_node = pVar14.second._M_node._M_node;
      }
      pVar14.second._M_node = _Var13._M_node;
      pVar14.first._M_node = iVar7._M_node;
    } while (iVar7._M_node != _Var13._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::RemoveBlockRequest(const uint256& hash, std::optional<NodeId> from_peer)
{
    auto range = mapBlocksInFlight.equal_range(hash);
    if (range.first == range.second) {
        // Block was not requested from any peer
        return;
    }

    // We should not have requested too many of this block
    Assume(mapBlocksInFlight.count(hash) <= MAX_CMPCTBLOCKS_INFLIGHT_PER_BLOCK);

    while (range.first != range.second) {
        auto [node_id, list_it] = range.first->second;

        if (from_peer && *from_peer != node_id) {
            range.first++;
            continue;
        }

        CNodeState& state = *Assert(State(node_id));

        if (state.vBlocksInFlight.begin() == list_it) {
            // First block on the queue was received, update the start download time for the next one
            state.m_downloading_since = std::max(state.m_downloading_since, GetTime<std::chrono::microseconds>());
        }
        state.vBlocksInFlight.erase(list_it);

        if (state.vBlocksInFlight.empty()) {
            // Last validated block on the queue for this peer was received.
            m_peers_downloading_from--;
        }
        state.m_stalling_since = 0us;

        range.first = mapBlocksInFlight.erase(range.first);
    }
}